

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  TestInfo *this;
  TestSuite *in_RSI;
  string *in_RDI;
  int i;
  bool comma;
  TestInfo *in_stack_00000190;
  char *in_stack_00000198;
  ostream *in_stack_000001a0;
  string kIndent;
  string kTestsuite;
  undefined8 in_stack_fffffffffffffc78;
  TestSuite *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc98;
  allocator<char> *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffd4c;
  undefined1 uVar5;
  string *in_stack_fffffffffffffd50;
  string *indent;
  string *in_stack_fffffffffffffd58;
  TestResult *result;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  string *in_stack_fffffffffffffd68;
  string *psVar6;
  ostream *in_stack_fffffffffffffd70;
  string local_250 [32];
  int local_230;
  byte local_229;
  string local_228 [32];
  string local_208 [32];
  TimeInMillis in_stack_fffffffffffffe18;
  string local_1e0 [32];
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [32];
  TimeInMillis in_stack_fffffffffffffed8;
  string local_120 [39];
  ostream local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  TestSuite *local_10;
  string *local_8;
  
  uVar5 = (undefined1)((uint)in_stack_fffffffffffffd4c >> 0x18);
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,
             (char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
             in_stack_fffffffffffffca0);
  std::allocator<char>::~allocator(&local_31);
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffffc98);
  psVar6 = local_8;
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffffc98);
  poVar4 = std::operator<<((ostream *)psVar6,local_88);
  std::operator<<(poVar4,"{\n");
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,
             (char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
             in_stack_fffffffffffffca0);
  TestSuite::name((TestSuite *)0x57f0e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,
             (char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
             in_stack_fffffffffffffca0);
  OutputJsonKey(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                (string *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,(bool)uVar5);
  iVar3 = (int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  poVar4 = &local_f9;
  psVar6 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcb0,
             (char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
             in_stack_fffffffffffffca0);
  iVar2 = TestSuite::reportable_test_count((TestSuite *)0x57f1d8);
  OutputJsonKey(poVar4,psVar6,(string *)CONCAT44(iVar2,in_stack_fffffffffffffd60),iVar3,
                in_stack_fffffffffffffd50,(bool)uVar5);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    result = (TestResult *)&stack0xfffffffffffffedf;
    indent = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcb0,
               (char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
               in_stack_fffffffffffffca0);
    iVar3 = TestSuite::failed_test_count((TestSuite *)0x57f28c);
    uVar5 = (undefined1)((uint)iVar3 >> 0x18);
    OutputJsonKey(poVar4,psVar6,(string *)CONCAT44(iVar2,in_stack_fffffffffffffd60),
                  (int)((ulong)result >> 0x20),indent,(bool)uVar5);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcb0,
               (char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
               in_stack_fffffffffffffca0);
    TestSuite::reportable_disabled_test_count((TestSuite *)0x57f333);
    OutputJsonKey(poVar4,psVar6,(string *)CONCAT44(iVar2,in_stack_fffffffffffffd60),
                  (int)((ulong)result >> 0x20),indent,(bool)uVar5);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcb0,
               (char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
               in_stack_fffffffffffffca0);
    OutputJsonKey(poVar4,psVar6,(string *)CONCAT44(iVar2,in_stack_fffffffffffffd60),
                  (int)((ulong)result >> 0x20),indent,(bool)uVar5);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator(&local_171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcb0,
               (char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
               in_stack_fffffffffffffca0);
    TestSuite::start_timestamp(local_10);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(in_stack_fffffffffffffed8);
    OutputJsonKey(poVar4,psVar6,(string *)CONCAT44(iVar2,in_stack_fffffffffffffd60),(string *)result
                  ,indent,(bool)uVar5);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator(&local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcb0,
               (char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
               in_stack_fffffffffffffca0);
    TestSuite::elapsed_time(local_10);
    FormatTimeInMillisAsDuration_abi_cxx11_(in_stack_fffffffffffffe18);
    OutputJsonKey(poVar4,psVar6,(string *)CONCAT44(iVar2,in_stack_fffffffffffffd60),(string *)result
                  ,indent,(bool)uVar5);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe1f);
    psVar6 = local_8;
    TestSuite::ad_hoc_test_result(local_10);
    TestPropertiesAsJson(result,indent);
    poVar4 = std::operator<<((ostream *)psVar6,local_228);
    std::operator<<(poVar4,",\n");
    std::__cxx11::string::~string(local_228);
  }
  poVar4 = std::operator<<((ostream *)local_8,local_68);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,local_30);
  std::operator<<(poVar4,"\": [\n");
  local_229 = 0;
  for (local_230 = 0; iVar2 = local_230, iVar3 = TestSuite::total_test_count((TestSuite *)0x57f9e8),
      iVar2 < iVar3; local_230 = local_230 + 1) {
    this = TestSuite::GetTestInfo
                     (in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
    bVar1 = TestInfo::is_reportable(this);
    if (bVar1) {
      if ((local_229 & 1) == 0) {
        local_229 = 1;
      }
      else {
        std::operator<<((ostream *)local_8,",\n");
      }
      in_stack_fffffffffffffc98 = local_8;
      TestSuite::name((TestSuite *)0x57fa6f);
      TestSuite::GetTestInfo
                (in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
      OutputJsonTestInfo(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
    }
  }
  poVar4 = std::operator<<((ostream *)local_8,"\n");
  poVar4 = std::operator<<(poVar4,local_68);
  poVar4 = std::operator<<(poVar4,"]\n");
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffffc98);
  poVar4 = std::operator<<(poVar4,local_250);
  std::operator<<(poVar4,"}");
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestSuite(
    std::ostream* stream, const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  const std::string kIndent = Indent(6);

  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_suite.name(), kIndent);
  OutputJsonKey(stream, kTestsuite, "tests", test_suite.reportable_test_count(),
                kIndent);
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "failures",
                  test_suite.failed_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "disabled",
                  test_suite.reportable_disabled_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "errors", 0, kIndent);
    OutputJsonKey(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsRFC3339(test_suite.start_timestamp()),
        kIndent);
    OutputJsonKey(stream, kTestsuite, "time",
                  FormatTimeInMillisAsDuration(test_suite.elapsed_time()),
                  kIndent, false);
    *stream << TestPropertiesAsJson(test_suite.ad_hoc_test_result(), kIndent)
            << ",\n";
  }

  *stream << kIndent << "\"" << kTestsuite << "\": [\n";

  bool comma = false;
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable()) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      OutputJsonTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
    }
  }
  *stream << "\n" << kIndent << "]\n" << Indent(4) << "}";
}